

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void lshbox::loadFvecs<float>(Matrix<float> *data,string *dataFile)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  ostream *poVar4;
  streamoff sVar5;
  float *pfVar6;
  int local_254;
  int local_250;
  int i;
  int dim;
  int cardinality;
  uint bytesPerRecord;
  int dimension;
  undefined8 local_238;
  uint local_230;
  uint fileSize;
  long local_220;
  ifstream fin;
  string *dataFile_local;
  Matrix<float> *data_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_bin,_S_ate);
  std::ifstream::ifstream(&local_220,pcVar3,_Var2);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"cannot open file ");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    poVar4 = std::operator<<(poVar4,pcVar3);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/common/util.h"
                  ,0x30,
                  "void lshbox::loadFvecs(lshbox::Matrix<DATATYPE> &, const string &) [DATATYPE = float]"
                 );
  }
  _bytesPerRecord = std::istream::tellg();
  sVar5 = std::fpos::operator_cast_to_long((fpos *)&bytesPerRecord);
  local_230 = (uint)sVar5;
  std::istream::seekg((long)&local_220,_S_beg);
  if (local_230 != 0) {
    std::istream::read((char *)&local_220,(long)&cardinality);
    dim = cardinality * 4 + 4;
    if (local_230 % (uint)dim != 0) {
      __assert_fail("fileSize % bytesPerRecord == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/common/util.h"
                    ,0x39,
                    "void lshbox::loadFvecs(lshbox::Matrix<DATATYPE> &, const string &) [DATATYPE = float]"
                   );
    }
    i = local_230 / (uint)dim;
    Matrix<float>::reset(data,cardinality,i);
    pfVar6 = Matrix<float>::getData(data);
    std::istream::read((char *)&local_220,(long)pfVar6);
    local_254 = 1;
    while( true ) {
      if (i <= local_254) {
        std::ifstream::close();
        std::ifstream::~ifstream(&local_220);
        return;
      }
      std::istream::read((char *)&local_220,(long)&local_250);
      if (local_250 != cardinality) break;
      pfVar6 = Matrix<float>::getData(data);
      std::istream::read((char *)&local_220,(long)(pfVar6 + local_254 * cardinality));
      local_254 = local_254 + 1;
    }
    __assert_fail("dim == dimension",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/common/util.h"
                  ,0x42,
                  "void lshbox::loadFvecs(lshbox::Matrix<DATATYPE> &, const string &) [DATATYPE = float]"
                 );
  }
  __assert_fail("fileSize != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/common/util.h"
                ,0x34,
                "void lshbox::loadFvecs(lshbox::Matrix<DATATYPE> &, const string &) [DATATYPE = float]"
               );
}

Assistant:

void loadFvecs(lshbox::Matrix<DATATYPE>& data, const string& dataFile) {
        std::ifstream fin(dataFile.c_str(), std::ios::binary | std::ios::ate);
        if (!fin) {
            std::cout << "cannot open file " << dataFile.c_str() << std::endl;
            assert(false);
        }
        unsigned fileSize = fin.tellg();
        fin.seekg(0, fin.beg);
        assert(fileSize != 0);

        int dimension;
        fin.read((char*)&dimension, sizeof(int));
        unsigned bytesPerRecord = dimension * sizeof(DATATYPE) + 4;
        assert(fileSize % bytesPerRecord == 0);
        int cardinality = fileSize / bytesPerRecord;

        data.reset(dimension, cardinality);
        fin.read((char *)(data.getData()), sizeof(float) * dimension);

        int dim;
        for (int i = 1; i < cardinality; ++i) {
            fin.read((char*)&dim, sizeof(int));
            assert(dim == dimension);
            fin.read((char *)(data.getData() + i * dimension), sizeof(float) * dimension);
        }
        fin.close();
    }